

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cpp
# Opt level: O3

path * wallet::BDBDataFile(path *__return_storage_ptr__,path *wallet_path)

{
  char cVar1;
  long in_FS_OFFSET;
  path pStack_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = std::filesystem::status((path *)wallet_path);
  if (cVar1 == '\x01') {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_00b556d2:
      __stack_chk_fail();
    }
    std::filesystem::__cxx11::path::path
              (&__return_storage_ptr__->super_path,&wallet_path->super_path);
  }
  else {
    std::filesystem::__cxx11::path::path(&pStack_48,&wallet_path->super_path);
    std::filesystem::__cxx11::path::_M_append(&pStack_48,10,"wallet.dat");
    std::filesystem::__cxx11::path::path(&__return_storage_ptr__->super_path,&pStack_48);
    std::filesystem::__cxx11::path::~path(&pStack_48);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_00b556d2;
  }
  return __return_storage_ptr__;
}

Assistant:

fs::path BDBDataFile(const fs::path& wallet_path)
{
    if (fs::is_regular_file(wallet_path)) {
        // Special case for backwards compatibility: if wallet path points to an
        // existing file, treat it as the path to a BDB data file in a parent
        // directory that also contains BDB log files.
        return wallet_path;
    } else {
        // Normal case: Interpret wallet path as a directory path containing
        // data and log files.
        return wallet_path / "wallet.dat";
    }
}